

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void boost::unordered::detail::foa::
     table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_48UL,_16UL>_>
     ::set_arrays(undefined8 *arrays,long al)

{
  byte bVar1;
  char *r;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  bVar1 = 0x40 - (char)*arrays;
  uVar4 = ((0x178L << (-(char)*arrays & 0x3fU)) + 0xeU) / 3 & 0xfffffffffffffff8;
  uVar3 = uVar4 * 3 + 0xf & 0xfffffffffffffff0;
  pvVar2 = *(void **)(al + 0x30);
  if ((ulong)((al + 0x30) - (long)pvVar2) < uVar3) {
    pvVar2 = operator_new(uVar4 * 3);
  }
  else {
    *(ulong *)(al + 0x30) = uVar3 + (long)pvVar2;
  }
  lVar5 = 0x168L << (bVar1 & 0x3f);
  arrays[3] = pvVar2;
  pvVar2 = (void *)((long)pvVar2 +
                   (ulong)(-((int)pvVar2 + (int)lVar5 + -0x18) & 0xf) + lVar5 + -0x18);
  arrays[2] = pvVar2;
  memset(pvVar2,0,0x10L << (bVar1 & 0x3f));
  *(undefined1 *)(arrays[2] + -2 + (1L << (bVar1 & 0x3f)) * 0x10) = 1;
  return;
}

Assistant:

static void set_arrays(table_arrays& arrays, allocator_type al, std::size_t,
                           std::false_type /* always allocate */) {
        using storage_traits = std::allocator_traits<allocator_type>;
        auto groups_size_index = arrays.groups_size_index;
        auto groups_size = size_policy::size(groups_size_index);

        auto sal = allocator_type(al);
        arrays.elements_ = storage_traits::allocate(sal, buffer_size(groups_size));

        /* Align arrays.groups to sizeof(group_type). table_iterator critically
         * depends on such alignment for its increment operation.
         */

        auto p = reinterpret_cast<unsigned char*>(arrays.elements() + groups_size * N - 1);
        p += (uintptr_t(sizeof(group_type)) - reinterpret_cast<uintptr_t>(p)) % sizeof(group_type);
        arrays.groups_ = group_type_pointer_traits::pointer_to(*reinterpret_cast<group_type*>(p));

        initialize_groups(arrays.groups(), groups_size,
                          is_trivially_default_constructible<group_type>{});
        arrays.groups()[groups_size - 1].set_sentinel();
    }